

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

_Bool gravity_value_isobject(gravity_value_t v)

{
  gravity_class_t *pgVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pgVar1 = v.isa;
  if ((((pgVar1 != (gravity_class_t *)0x0) && (gravity_class_int != pgVar1)) &&
      (gravity_class_float != pgVar1)) &&
     ((gravity_class_bool != pgVar1 && (v.field_1.n != 0 && gravity_class_null != pgVar1)))) {
    iVar5 = (int)v.isa;
    iVar6 = v.isa._4_4_;
    auVar8._0_4_ = -(uint)((int)gravity_class_instance == iVar5);
    auVar8._4_4_ = -(uint)((int)((ulong)gravity_class_instance >> 0x20) == iVar6);
    auVar8._8_4_ = -(uint)((int)gravity_class_module == iVar5);
    auVar8._12_4_ = -(uint)((int)((ulong)gravity_class_module >> 0x20) == iVar6);
    auVar11._4_4_ = auVar8._0_4_;
    auVar11._0_4_ = auVar8._4_4_;
    auVar11._8_4_ = auVar8._12_4_;
    auVar11._12_4_ = auVar8._8_4_;
    auVar10._0_4_ = -(uint)((int)gravity_class_fiber == iVar5);
    auVar10._4_4_ = -(uint)((int)((ulong)gravity_class_fiber >> 0x20) == iVar6);
    auVar10._8_4_ = -(uint)((int)gravity_class_class == iVar5);
    auVar10._12_4_ = -(uint)((int)((ulong)gravity_class_class >> 0x20) == iVar6);
    auVar9._4_4_ = auVar10._0_4_;
    auVar9._0_4_ = auVar10._4_4_;
    auVar9._8_4_ = auVar10._12_4_;
    auVar9._12_4_ = auVar10._8_4_;
    auVar10 = packssdw(auVar9 & auVar10,auVar11 & auVar8);
    auVar2._0_4_ = -(uint)((int)gravity_class_function == iVar5);
    auVar2._4_4_ = -(uint)((int)((ulong)gravity_class_function >> 0x20) == iVar6);
    auVar2._8_4_ = -(uint)((int)gravity_class_closure == iVar5);
    auVar2._12_4_ = -(uint)((int)((ulong)gravity_class_closure >> 0x20) == iVar6);
    auVar7._4_4_ = auVar2._0_4_;
    auVar7._0_4_ = auVar2._4_4_;
    auVar7._8_4_ = auVar2._12_4_;
    auVar7._12_4_ = auVar2._8_4_;
    auVar4._0_4_ = -(uint)((int)gravity_class_string == iVar5);
    auVar4._4_4_ = -(uint)((int)((ulong)gravity_class_string >> 0x20) == iVar6);
    auVar4._8_4_ = -(uint)((int)gravity_class_object == iVar5);
    auVar4._12_4_ = -(uint)((int)((ulong)gravity_class_object >> 0x20) == iVar6);
    auVar3._4_4_ = auVar4._0_4_;
    auVar3._0_4_ = auVar4._4_4_;
    auVar3._8_4_ = auVar4._12_4_;
    auVar3._12_4_ = auVar4._8_4_;
    auVar4 = packssdw(auVar3 & auVar4,auVar7 & auVar2);
    auVar4 = packssdw(auVar4,auVar10);
    return (((gravity_class_map == pgVar1 || gravity_class_list == pgVar1) ||
            gravity_class_range == pgVar1) || gravity_class_upvalue == pgVar1) ||
           ((((((((auVar4 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar4 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar4 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar4 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar4[0xf] < '\0'
           );
  }
  return false;
}

Assistant:

bool gravity_value_isobject (gravity_value_t v) {
    // was:
    // if (VALUE_ISA_NOTVALID(v)) return false;
    // if (VALUE_ISA_INT(v)) return false;
    // if (VALUE_ISA_FLOAT(v)) return false;
    // if (VALUE_ISA_BOOL(v)) return false;
    // if (VALUE_ISA_NULL(v)) return false;
    // if (VALUE_ISA_UNDEFINED(v)) return false;
    // return true;

    if ((v.isa == NULL) || (v.isa == gravity_class_int) || (v.isa == gravity_class_float) ||
        (v.isa == gravity_class_bool) || (v.isa == gravity_class_null) || (v.p == NULL)) return false;
    
    // extra check to allow ONLY known objects
    if ((v.isa == gravity_class_string) || (v.isa == gravity_class_object) || (v.isa == gravity_class_function) ||
        (v.isa == gravity_class_closure) || (v.isa == gravity_class_fiber) || (v.isa == gravity_class_class) ||
        (v.isa == gravity_class_instance) || (v.isa == gravity_class_module) || (v.isa == gravity_class_list) ||
        (v.isa == gravity_class_map) || (v.isa == gravity_class_range) || (v.isa == gravity_class_upvalue)) return true;
    
    return false;
}